

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void bpool(kmp_info_t *th,void *buf,bufsize len)

{
  kmp_info_t *th_00;
  ulong uVar1;
  ulong in_RDX;
  ulong *in_RSI;
  kmp_info_t *in_RDI;
  bhead_t *bn;
  bfhead_t *b;
  thr_data_t *thr;
  bfhead_t *in_stack_ffffffffffffffc8;
  thr_data_t *in_stack_ffffffffffffffd0;
  
  th_00 = (kmp_info_t *)get_thr_data(in_RDI);
  __kmp_bget_dequeue(th_00);
  uVar1 = in_RDX & 0xfffffffffffffff8;
  if (*(long *)(th_00->th_pad + 0x428) == 0) {
    *(ulong *)(th_00->th_pad + 0x428) = uVar1;
  }
  else if (uVar1 != *(ulong *)(th_00->th_pad + 0x428)) {
    *(char *)((long)th_00 + 0x428) = -1;
    *(char *)((long)th_00 + 0x429) = -1;
    *(char *)((long)th_00 + 0x42a) = -1;
    *(char *)((long)th_00 + 0x42b) = -1;
    *(char *)((long)th_00 + 0x42c) = -1;
    *(char *)((long)th_00 + 0x42d) = -1;
    *(char *)((long)th_00 + 0x42e) = -1;
    *(char *)((long)th_00 + 0x42f) = -1;
  }
  *(long *)(th_00->th_pad + 0x3e0) = *(long *)(th_00->th_pad + 0x3e0) + 1;
  *(long *)(th_00->th_pad + 0x3d8) = *(long *)(th_00->th_pad + 0x3d8) + 1;
  in_RSI[1] = 0;
  in_RSI[2] = uVar1 - 0x20;
  *in_RSI = (ulong)in_RDI | 1;
  __kmp_bget_insert_into_freelist(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(ulong *)((long)in_RSI + (uVar1 - 0x18)) = uVar1 - 0x20;
  *(undefined8 *)((long)in_RSI + (uVar1 - 0x10)) = 0x8000000000000000;
  return;
}

Assistant:

static void bpool(kmp_info_t *th, void *buf, bufsize len) {
  /*    int bin = 0; */
  thr_data_t *thr = get_thr_data(th);
  bfhead_t *b = BFH(buf);
  bhead_t *bn;

  __kmp_bget_dequeue(th); /* Release any queued buffers */

#ifdef SizeQuant
  len &= ~(SizeQuant - 1);
#endif
  if (thr->pool_len == 0) {
    thr->pool_len = len;
  } else if (len != thr->pool_len) {
    thr->pool_len = -1;
  }
#if BufStats
  thr->numpget++; /* Number of block acquisitions */
  thr->numpblk++; /* Number of blocks total */
  KMP_DEBUG_ASSERT(thr->numpblk == thr->numpget - thr->numprel);
#endif /* BufStats */

  /* Since the block is initially occupied by a single free  buffer,
     it  had  better  not  be  (much) larger than the largest buffer
     whose size we can store in bhead.bb.bsize. */
  KMP_DEBUG_ASSERT(len - sizeof(bhead_t) <= -((bufsize)ESent + 1));

  /* Clear  the  backpointer at  the start of the block to indicate that
     there  is  no  free  block  prior  to  this   one.    That   blocks
     recombination when the first block in memory is released. */
  b->bh.bb.prevfree = 0;

  /* Create a dummy allocated buffer at the end of the pool.  This dummy
     buffer is seen when a buffer at the end of the pool is released and
     blocks  recombination  of  the last buffer with the dummy buffer at
     the end.  The length in the dummy buffer  is  set  to  the  largest
     negative  number  to  denote  the  end  of  the pool for diagnostic
     routines (this specific value is  not  counted  on  by  the  actual
     allocation and release functions). */
  len -= sizeof(bhead_t);
  b->bh.bb.bsize = (bufsize)len;
  /* Set the owner of this buffer */
  TCW_PTR(b->bh.bb.bthr,
          (kmp_info_t *)((kmp_uintptr_t)th |
                         1)); // mark the buffer as allocated address

  /* Chain the new block to the free list. */
  __kmp_bget_insert_into_freelist(thr, b);

#ifdef FreeWipe
  (void)memset(((char *)b) + sizeof(bfhead_t), 0x55,
               (size_t)(len - sizeof(bfhead_t)));
#endif
  bn = BH(((char *)b) + len);
  bn->bb.prevfree = (bufsize)len;
  /* Definition of ESent assumes two's complement! */
  KMP_DEBUG_ASSERT((~0) == -1 && (bn != 0));

  bn->bb.bsize = ESent;
}